

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerPool.cpp
# Opt level: O2

TimerHandle __thiscall TimerPool::Timer::Create(Timer *this,PoolHandle *pool,string *name)

{
  _Impl *this_00;
  allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>,_std::allocator<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>_>,_(__gnu_cxx::_Lock_policy)2>_>
  *this_01;
  pointer p_Var1;
  pointer p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TimerHandle TVar3;
  __allocator_type __a2_1;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>,_std::allocator<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::UserTimer,_std::allocator<(anonymous_namespace)::UserTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_70;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var1 = (pointer)operator_new(0xb8);
  local_90._M_alloc = &__a2;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00109c30;
  this_00 = &p_Var1->_M_impl;
  local_90._M_ptr = p_Var1;
  Timer((Timer *)this_00,pool,name);
  local_90._M_ptr = (pointer)0x0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__Timer_00109c80;
  local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>,_std::allocator<(anonymous_namespace)::EnableConstructor<TimerPool::Timer>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_90);
  std::__weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>::_M_assign
            ((__weak_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8),(Timer *)this_00,&local_78);
  p_Var2 = (pointer)operator_new(0x20);
  local_70._M_alloc = &__a2_1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00109cb8;
  local_50._M_ptr = (element_type *)local_80;
  local_70._M_ptr = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count(&local_50._M_refcount,&local_78);
  std::__shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2> *)&p_Var2->_M_impl,
             &local_50);
  std::__shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<TimerPool,_(__gnu_cxx::_Lock_policy)2> *)&local_90,
             (long)(p_Var2->_M_impl)._M_storage._M_storage.__align + 0x40);
  this_01 = local_90._M_alloc;
  if ((TimerPool *)local_90._M_alloc != (TimerPool *)0x0) {
    std::__shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2> *)&__a2,&local_50);
    registerTimer((TimerPool *)this_01,(TimerHandle *)&__a2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  local_70._M_ptr = (pointer)0x0;
  local_40 = &p_Var2->_M_impl;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::UserTimer,_std::allocator<(anonymous_namespace)::UserTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_70);
  this->_vptr_Timer = (_func_int **)local_80;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<TimerPool::Timer>,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  TVar3.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar3.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TimerHandle)TVar3.super___shared_ptr<TimerPool::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerPool::Timer::TimerHandle TimerPool::Timer::Create(const PoolHandle& pool, const std::string& name)
{
    const auto timer      = std::make_shared<EnableConstructor<Timer>>(pool, name);
    const auto userHandle = std::make_shared<UserTimer>(timer);

    return std::shared_ptr<Timer>(userHandle, timer.get());
}